

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  Severity SVar2;
  cx_string<2UL> cVar3;
  _Ios_Openmode _Var4;
  SessionWriter *pSVar5;
  data_ref pacVar6;
  bool bVar7;
  ofstream logfile;
  uint64_t _binlog_sid_v;
  memory_order __b;
  memory_order __b_1;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  EventSource *in_stack_fffffffffffffc10;
  basic_ofstream<char,_std::char_traits<char>_> *out;
  char (*in_stack_fffffffffffffc18) [10];
  __atomic_base<unsigned_long> writer;
  EventSource *in_stack_fffffffffffffc38;
  Session *this;
  long local_320 [64];
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b [4];
  allocator local_117;
  allocator local_116;
  allocator local_115 [20];
  allocator local_101 [17];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  undefined8 local_90;
  string local_88 [32];
  string local_68 [32];
  __atomic_base<unsigned_long> local_48;
  uint local_3c;
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_3c = 0;
  pSVar5 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar5);
  SVar2 = binlog::Session::minSeverity((Session *)0x1024e7);
  if (SVar2 < 0x81) {
    local_28 = &main::_binlog_sid;
    local_2c = 0;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_38 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_48 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar5 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar5);
      local_101[1] = (allocator)0x0;
      local_101[2] = (allocator)0x0;
      local_101[3] = (allocator)0x0;
      local_101[4] = (allocator)0x0;
      local_101[5] = (allocator)0x0;
      local_101[6] = (allocator)0x0;
      local_101[7] = (allocator)0x0;
      local_101[8] = (allocator)0x0;
      local_101[9] = (allocator)0x80;
      local_101[10] = (allocator)0x0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"main",local_101);
      local_11f = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"main",local_115);
      local_11e = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/HelloWorld.cpp"
                 ,&local_116);
      local_11d = 1;
      local_90._0_5_ = 0xc;
      local_90._5_1_ = (_Tp_alloc_type)0x0;
      local_90._6_2_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Hello {}!",&local_117);
      local_11c = 1;
      cVar3 = binlog::detail::concatenated_tags<char_const(&)[10],char_const(&)[6]>
                        (in_stack_fffffffffffffc18,(char (*) [6])in_stack_fffffffffffffc10);
      local_11b._1_2_ = cVar3._data._0_2_;
      local_11b[3] = cVar3._data[2];
      pacVar6 = mserialize::cx_string<2UL>::data((cx_string<2UL> *)(local_11b + 1));
      this = (Session *)local_11b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,*pacVar6,(allocator *)this);
      local_11c = 0;
      local_11d = 0;
      local_11e = 0;
      local_11f = 0;
      local_48._M_i = binlog::Session::addEventSource(this,in_stack_fffffffffffffc38);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffc10);
      std::allocator<char>::~allocator((allocator<char> *)local_11b);
      std::allocator<char>::~allocator((allocator<char> *)&local_117);
      std::allocator<char>::~allocator((allocator<char> *)&local_116);
      std::allocator<char>::~allocator((allocator<char> *)local_115);
      std::allocator<char>::~allocator((allocator<char> *)local_101);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_48._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    pSVar5 = binlog::default_thread_local_writer();
    writer._M_i = local_48._M_i;
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[10],char_const(&)[6]>
              ((SessionWriter *)writer._M_i,(uint64_t)pSVar5,(uint64_t)in_stack_fffffffffffffc10,
               (char (*) [10])CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               (char (*) [6])0x102a75);
  }
  _Var4 = std::operator|(_S_out,_S_bin);
  out = (basic_ofstream<char,_std::char_traits<char>_> *)local_320;
  std::ofstream::ofstream(out,"hello.blog",_Var4);
  binlog::consume<std::ofstream>(out);
  bVar1 = std::ios::operator!((ios *)((long)local_320 + *(long *)(local_320[0] + -0x18)));
  bVar7 = (bVar1 & 1) != 0;
  if (bVar7) {
    std::operator<<((ostream *)&std::cerr,"Failed to write hello.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Binary log written to hello.blog\n");
  }
  local_3c = (uint)bVar7;
  std::ofstream::~ofstream(local_320);
  return local_3c;
}

Assistant:

int main()
{
  BINLOG_INFO("Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  binlog::consume(logfile);
//]

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;

//[hello
}